

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

int __thiscall EntryBTree::equalKeyCompareOp(EntryBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  
  pbVar4 = data + 2;
  uVar6 = (ulong)data[1];
  if ((char)data[1] < '\0') {
    uVar5 = 0x80;
    do {
      uVar3 = (uVar6 - uVar5) * 0x100;
      bVar1 = *pbVar4;
      pbVar4 = pbVar4 + 1;
      uVar6 = bVar1 | uVar3;
      uVar5 = uVar5 << 7;
    } while ((uVar3 & uVar5) != 0);
  }
  uVar2 = 0xffffffff;
  if (((uint)uVar6 <= key->m_nameIndex) && (uVar2 = 1, key->m_nameIndex <= (uint)uVar6)) {
    uVar6 = 0;
    if (((*data & 2) != 0) && (uVar6 = (ulong)*pbVar4, (char)*pbVar4 < '\0')) {
      uVar5 = 0x80;
      do {
        pbVar4 = pbVar4 + 1;
        uVar3 = (uVar6 - uVar5) * 0x100;
        uVar6 = *pbVar4 | uVar3;
        uVar5 = uVar5 << 7;
      } while ((uVar3 & uVar5) != 0);
    }
    uVar2 = 0xffffffff;
    if ((uint)uVar6 <= key->m_extIndex) {
      uVar2 = (uint)((uint)uVar6 < key->m_extIndex);
    }
  }
  return uVar2;
}

Assistant:

static inline uint64_t decodeBitsAndAdvance(const uint8_t*& data)
{
	uint64_t value = *data++;
	uint64_t mask = 0x80;
	while (value & mask) {
		value = ((value - mask) << 8) | (*data++);
		mask <<= 7;
	}
	return value;
}